

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_
          (string *__return_storage_ptr__,Graph *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *summary,bool verbose)

{
  int *piVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  void *pvVar4;
  uint32_t uVar5;
  pointer ppNVar6;
  Node *this_00;
  invalid_argument *this_01;
  undefined7 in_register_00000009;
  ulong uVar7;
  bool bVar8;
  Node **it;
  uint uVar9;
  long lVar10;
  pointer puVar11;
  iterator __position;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  pointer ppNVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_id_to_column;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if (summary == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar13 = CONCAT71(in_register_00000009,verbose) & 0xffffffff;
  GenerateConsensus_abi_cxx11_(__return_storage_ptr__,this);
  puVar11 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current != puVar11) {
    (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar11;
    __position._M_current = puVar11;
  }
  if ((char)uVar13 == '\0') {
    ppNVar6 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar2 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar6 != ppNVar2) {
      do {
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        if (__position._M_current ==
            (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                    (summary,__position,(int *)&local_48);
        }
        else {
          *__position._M_current = 0;
          (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar5 = Node::Coverage(*ppNVar6);
        __position._M_current =
             (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        __position._M_current[-1] = __position._M_current[-1] + uVar5;
        ppNVar3 = ((*ppNVar6)->aligned_nodes).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppNVar16 = ((*ppNVar6)->aligned_nodes).
                        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppNVar16 != ppNVar3;
            ppNVar16 = ppNVar16 + 1) {
          uVar5 = Node::Coverage(*ppNVar16);
          __position._M_current =
               (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          __position._M_current[-1] = __position._M_current[-1] + uVar5;
        }
        ppNVar6 = ppNVar6 + 1;
      } while (ppNVar6 != ppNVar2);
    }
  }
  else {
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (summary,((long)(this->consensus_).
                              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->consensus_).
                              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) *
                       (ulong)(this->num_codes_ + 1),(value_type_conflict1 *)&local_48);
    InitializeMultipleSequenceAlignment(&local_48,this,(uint32_t *)0x0);
    ppNVar6 = (this->sequences_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->sequences_).
        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar6) {
      uVar14 = 0;
LAB_001094d7:
      this_00 = ppNVar6[uVar14];
      lVar10 = CONCAT44(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_);
      uVar15 = 0;
      bVar8 = false;
      puVar12 = (uint *)(lVar10 + (ulong)this_00->id * 4);
      do {
        ppNVar6 = (this->consensus_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(this->consensus_).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6 >> 3;
        if (uVar15 < uVar7) {
          do {
            uVar9 = *(uint *)(lVar10 + (ulong)ppNVar6[uVar15]->id * 4);
            if (*puVar12 <= uVar9) {
              if (uVar9 == *puVar12) {
                if (bVar8) {
                  puVar11 = (summary->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  uVar9 = (int)uVar13 + 1;
                  if (uVar9 < (uint)uVar15) {
                    uVar13 = (ulong)uVar9;
                    do {
                      piVar1 = (int *)((long)puVar11 +
                                      uVar13 * 4 + (ulong)this->num_codes_ * uVar7 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar13 = uVar13 + 1;
                    } while (uVar13 < uVar15);
                  }
                }
                else {
                  puVar11 = (summary->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                }
                bVar8 = true;
                puVar11[this_00->code * uVar7 + uVar15] =
                     puVar11[this_00->code * uVar7 + uVar15] + 1;
                uVar13 = uVar15;
              }
              break;
            }
            uVar15 = (ulong)((uint)uVar15 + 1);
          } while (uVar15 < uVar7);
        }
        if ((uVar7 == uVar15) ||
           (this_00 = Node::Successor(this_00,(uint32_t)uVar14), this_00 == (Node *)0x0))
        goto LAB_00109598;
        lVar10 = CONCAT44(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start._0_4_);
        puVar12 = (uint *)(lVar10 + (ulong)this_00->id * 4);
      } while( true );
    }
LAB_001095b3:
    pvVar4 = (void *)CONCAT44(local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4)
      ;
    }
  }
  return __return_storage_ptr__;
LAB_00109598:
  ppNVar6 = (this->sequences_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar14 = (ulong)((uint32_t)uVar14 + 1);
  if ((ulong)((long)(this->sequences_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6 >> 3) <= uVar14)
  goto LAB_001095b3;
  goto LAB_001094d7;
}

Assistant:

std::string Graph::GenerateConsensus(
    std::vector<std::uint32_t>* summary,
    bool verbose) {
  if (!summary) {
    throw std::invalid_argument(
        "[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
  }

  auto dst = GenerateConsensus();

  summary->clear();
  if (!verbose) {
    for (const auto& it : consensus_) {
      summary->emplace_back(0);
      summary->back() += it->Coverage();
      for (const auto& jt : it->aligned_nodes) {
        summary->back() += jt->Coverage();
      }
    }
  } else {
    summary->resize((num_codes_ + 1) * consensus_.size(), 0);
    auto node_id_to_column = InitializeMultipleSequenceAlignment();

    for (std::uint32_t i = 0; i < sequences_.size(); ++i) {
      Node* it = sequences_[i];
      std::uint32_t c = 0, p, column = node_id_to_column[it->id];
      bool is_gap = false;
      while (true) {
        for (; c < consensus_.size(); ++c) {
          if (node_id_to_column[consensus_[c]->id] < column) {
            continue;
          } else {
            if (node_id_to_column[consensus_[c]->id] == column) {
              if (is_gap) {
                for (std::uint32_t j = p + 1; j < c; ++j) {
                  ++(*summary)[num_codes_ * consensus_.size() + j];
                }
              }
              is_gap = true;
              p = c;
              ++(*summary)[it->code * consensus_.size() + c];
            }
            break;
          }
        }
        if (c == consensus_.size() || !(it = it->Successor(i))) {
          break;
        }
        column = node_id_to_column[it->id];
      }
    }
  }

  return dst;
}